

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

int __thiscall btConvexHullInternal::Rational128::compare(Rational128 *this,Rational128 *b)

{
  long in_RSI;
  long in_RDI;
  int cmp;
  Int128 dbnHigh;
  Int128 dbnLow;
  Int128 nbdHigh;
  Int128 nbdLow;
  Int128 *in_stack_000000e8;
  Int128 *in_stack_000000f0;
  undefined1 in_stack_000000f8 [16];
  undefined1 in_stack_00000108 [16];
  int64_t in_stack_ffffffffffffff80;
  Rational128 *in_stack_ffffffffffffff88;
  Int128 local_58;
  Int128 local_48;
  Int128 local_38;
  Int128 local_28 [2];
  int local_4;
  
  if (*(int *)(in_RDI + 0x20) == *(int *)(in_RSI + 0x20)) {
    if (*(int *)(in_RDI + 0x20) == 0) {
      local_4 = 0;
    }
    else if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
      Int128::Int128(local_28);
      Int128::Int128(&local_38);
      Int128::Int128(&local_48);
      Int128::Int128(&local_58);
      DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
                ((Int128)in_stack_00000108,(Int128)in_stack_000000f8,in_stack_000000f0,
                 in_stack_000000e8);
      DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
                ((Int128)in_stack_00000108,(Int128)in_stack_000000f8,in_stack_000000f0,
                 in_stack_000000e8);
      local_4 = Int128::ucmp(&local_38,&local_58);
      if (local_4 == 0) {
        local_4 = Int128::ucmp(local_28,&local_48);
        local_4 = local_4 * *(int *)(in_RDI + 0x20);
      }
      else {
        local_4 = local_4 * *(int *)(in_RDI + 0x20);
      }
    }
    else {
      local_4 = compare(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      local_4 = -local_4;
    }
  }
  else {
    local_4 = *(int *)(in_RDI + 0x20) - *(int *)(in_RSI + 0x20);
  }
  return local_4;
}

Assistant:

int btConvexHullInternal::Rational128::compare(const Rational128& b) const
{
	if (sign != b.sign)
	{
		return sign - b.sign;
	}
	else if (sign == 0)
	{
		return 0;
	}
	if (isInt64)
	{
		return -b.compare(sign * (int64_t) numerator.low);
	}

	Int128 nbdLow, nbdHigh, dbnLow, dbnHigh;
	DMul<Int128, uint64_t>::mul(numerator, b.denominator, nbdLow, nbdHigh);
	DMul<Int128, uint64_t>::mul(denominator, b.numerator, dbnLow, dbnHigh);

	int cmp = nbdHigh.ucmp(dbnHigh);
	if (cmp)
	{
		return cmp * sign;
	}
	return nbdLow.ucmp(dbnLow) * sign;
}